

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall
QFileSystemModelPrivate::removeNode
          (QFileSystemModelPrivate *this,QFileSystemNode *parentNode,QString *name)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QFileSystemModelPrivate *this_00;
  QFileSystemNode *this_01;
  int in_ESI;
  QFileSystemModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileSystemNode *node;
  int vLocation;
  bool indexHidden;
  QFileSystemModel *q;
  QModelIndex parent;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QFileSystemNode *in_stack_ffffffffffffff90;
  QFileSystemNode *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 local_20 [16];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileSystemModelPrivate *)q_func(in_RDI);
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  index((QFileSystemModelPrivate *)local_20,(char *)in_RDI,in_ESI);
  bVar1 = isHiddenByFilter((QFileSystemModelPrivate *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98,(QModelIndex *)in_stack_ffffffffffffff90);
  iVar2 = QFileSystemNode::visibleLocation
                    (in_stack_ffffffffffffff90,
                     (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if ((-1 < iVar2) && (!bVar1)) {
    iVar3 = translateVisibleLocation(this_00,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    translateVisibleLocation(this_00,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    QAbstractItemModel::beginRemoveRows((QModelIndex *)this_00,(int)local_20,iVar3);
  }
  this_01 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::take
                      ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)
                       in_stack_ffffffffffffff90,
                       (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (this_01 != (QFileSystemNode *)0x0) {
    QFileSystemNode::~QFileSystemNode(this_01);
    operator_delete(this_01,0x50);
  }
  if ((-1 < iVar2) &&
     (QList<QString>::removeAt
                ((QList<QString> *)this_01,
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)), !bVar1)) {
    QAbstractItemModel::endRemoveRows();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModelPrivate::removeNode(QFileSystemModelPrivate::QFileSystemNode *parentNode, const QString& name)
{
    Q_Q(QFileSystemModel);
    QModelIndex parent = index(parentNode);
    bool indexHidden = isHiddenByFilter(parentNode, parent);

    int vLocation = parentNode->visibleLocation(name);
    if (vLocation >= 0 && !indexHidden)
        q->beginRemoveRows(parent, translateVisibleLocation(parentNode, vLocation),
                                       translateVisibleLocation(parentNode, vLocation));
    QFileSystemNode * node = parentNode->children.take(name);
    delete node;
    // cleanup sort files after removing rather then re-sorting which is O(n)
    if (vLocation >= 0)
        parentNode->visibleChildren.removeAt(vLocation);
    if (vLocation >= 0 && !indexHidden)
        q->endRemoveRows();
}